

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeDirectoryCommand.cxx
# Opt level: O0

void __thiscall
cmIncludeDirectoryCommand::NormalizeInclude(cmIncludeDirectoryCommand *this,string *inc)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  allocator local_49;
  string local_48 [8];
  string tmp;
  size_type e;
  size_type b;
  string *inc_local;
  cmIncludeDirectoryCommand *this_local;
  
  uVar2 = std::__cxx11::string::find_first_not_of((char *)inc,0x90785f);
  tmp.field_2._8_8_ = std::__cxx11::string::find_last_not_of((char *)inc,0x90785f);
  if ((uVar2 == 0xffffffffffffffff) || (tmp.field_2._8_8_ == -1)) {
    std::__cxx11::string::operator=((string *)inc,"");
  }
  else {
    std::__cxx11::string::assign((string *)inc,(ulong)inc,uVar2);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar1 = cmSystemTools::IsOff(pcVar3);
    if (!bVar1) {
      cmsys::SystemTools::ConvertToUnixSlashes(inc);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar1 = cmsys::SystemTools::FileIsFullPath(pcVar3);
      if ((!bVar1) && (bVar1 = StartsWithGeneratorExpression(inc), !bVar1)) {
        pcVar3 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,pcVar3,&local_49);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
        std::__cxx11::string::operator+=(local_48,"/");
        std::__cxx11::string::operator+=(local_48,(string *)inc);
        std::__cxx11::string::operator=((string *)inc,local_48);
        std::__cxx11::string::~string(local_48);
      }
    }
  }
  return;
}

Assistant:

void cmIncludeDirectoryCommand::NormalizeInclude(std::string &inc)
{
  std::string::size_type b = inc.find_first_not_of(" \r");
  std::string::size_type e = inc.find_last_not_of(" \r");
  if ((b!=inc.npos) && (e!=inc.npos))
    {
    inc.assign(inc, b, 1+e-b);   // copy the remaining substring
    }
  else
    {
    inc = "";
    return;
    }

  if (!cmSystemTools::IsOff(inc.c_str()))
    {
    cmSystemTools::ConvertToUnixSlashes(inc);

    if(!cmSystemTools::FileIsFullPath(inc.c_str()))
      {
      if(!StartsWithGeneratorExpression(inc))
        {
        std::string tmp = this->Makefile->GetCurrentSourceDirectory();
        tmp += "/";
        tmp += inc;
        inc = tmp;
        }
      }
    }
}